

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

Scal __thiscall LinearExpert::queryXafterZ(LinearExpert *this,X *x)

{
  double dVar1;
  ResScalar RVar2;
  double dVar3;
  Scalar __x;
  double dVar4;
  X xInvVar;
  void *local_58 [2];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_48;
  double local_30;
  
  local_48.m_rhs = &this->pred_x;
  local_48.m_lhs = x;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (&this->dx,&local_48);
  local_48.m_lhs = &this->invPsi;
  local_30 = this->gamma + 1.0;
  local_48.m_rhs =
       (RhsNested)
       (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_58,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_48);
  local_48.m_lhs = &this->dx;
  RVar2 = Eigen::internal::
          dot_nocheck<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
          ::run((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_48,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58);
  dVar3 = exp(RVar2 * -0.5);
  this->rbf_x = dVar3;
  this->rbf_zx = this->rbf_z * dVar3;
  dVar1 = this->p_z_T;
  __x = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                  ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58);
  if (__x < 0.0) {
    dVar4 = sqrt(__x);
  }
  else {
    dVar4 = SQRT(__x);
  }
  dVar4 = dVar3 * dVar1 * dVar4;
  this->p_zx = dVar4;
  free(local_58[0]);
  return dVar4;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryXafterZ( X const &x )
{
    dx = x - pred_x;

    X xInvVar = invPsi / (1.0 + gamma);

    rbf_x = exp(-0.5*dx.cwiseAbs2().dot(xInvVar));
    rbf_zx = rbf_z * rbf_x;
    p_zx = p_z_T * rbf_x * sqrt(xInvVar.prod());

    return p_zx;
}